

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O0

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,Program *program)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_40;
  _Base_ptr local_38;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
  local_20;
  iterator it;
  Program *program_local;
  CppPrinter *this_local;
  
  it._M_node = (_Base_ptr)program;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
  ::_Rb_tree_iterator(&local_20);
  printStart(this);
  local_28 = (_Base_ptr)Program::begin_abi_cxx11_(it._M_node);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node = (_Base_ptr)Program::end_abi_cxx11_(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
             ::operator->(&local_20);
    generatePrototypes(this,ppVar2->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
    ::operator++(&local_20);
  }
  local_38 = (_Base_ptr)Program::begin_abi_cxx11_(it._M_node);
  local_20._M_node = local_38;
  while( true ) {
    local_40._M_node = (_Base_ptr)Program::end_abi_cxx11_(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_40);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
             ::operator->(&local_20);
    (**(ppVar2->second->super_ASTNode)._vptr_ASTNode)(ppVar2->second,this);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
    ::operator++(&local_20);
  }
  printEnd(this);
  return;
}

Assistant:

void CppPrinter::visit(Program *program) {
    std::map<std::string, SourceFile*>::iterator it;

    printStart();

    for (it = program->begin(); it != program->end(); ++it) {
        generatePrototypes(it->second);
    }

    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }

    printEnd();
}